

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

void nghttp2_hd_inflate_free(nghttp2_hd_inflater *inflater)

{
  hd_inflate_keep_free((nghttp2_hd_inflater *)0x12155e);
  nghttp2_rcbuf_decref((nghttp2_rcbuf *)0x12156e);
  nghttp2_rcbuf_decref((nghttp2_rcbuf *)0x12157e);
  hd_context_free((nghttp2_hd_context *)0x121587);
  return;
}

Assistant:

void nghttp2_hd_inflate_free(nghttp2_hd_inflater *inflater) {
  hd_inflate_keep_free(inflater);

  nghttp2_rcbuf_decref(inflater->valuercbuf);
  nghttp2_rcbuf_decref(inflater->namercbuf);

  hd_context_free(&inflater->ctx);
}